

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::BlobProto::InternalSwap(BlobProto *this,BlobProto *other)

{
  int32 iVar1;
  uint32 uVar2;
  int iVar3;
  BlobShape *pBVar4;
  void *pvVar5;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar6;
  void *pvVar7;
  UnknownFieldSet *pUVar8;
  UnknownFieldSet *pUVar9;
  
  google::protobuf::RepeatedField<float>::InternalSwap(&this->data_,&other->data_);
  google::protobuf::RepeatedField<float>::InternalSwap(&this->diff_,&other->diff_);
  google::protobuf::RepeatedField<double>::InternalSwap(&this->double_data_,&other->double_data_);
  google::protobuf::RepeatedField<double>::InternalSwap(&this->double_diff_,&other->double_diff_);
  pBVar4 = this->shape_;
  this->shape_ = other->shape_;
  other->shape_ = pBVar4;
  iVar1 = this->num_;
  this->num_ = other->num_;
  other->num_ = iVar1;
  iVar1 = this->channels_;
  this->channels_ = other->channels_;
  other->channels_ = iVar1;
  iVar1 = this->height_;
  this->height_ = other->height_;
  other->height_ = iVar1;
  iVar1 = this->width_;
  this->width_ = other->width_;
  other->width_ = iVar1;
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  pvVar7 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  pvVar5 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar7 & 1) == 0) {
    if (((ulong)pvVar5 & 1) == 0) goto LAB_003f0502;
LAB_003f04ea:
    pUVar9 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar5 & 1) != 0) goto LAB_003f04ea;
    pUVar9 = google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(other->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
    pvVar7 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
  }
  if (((ulong)pvVar7 & 1) == 0) {
    pUVar8 = google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
  }
  else {
    pUVar8 = (UnknownFieldSet *)((ulong)pvVar7 & 0xfffffffffffffffe);
  }
  pvVar6 = pUVar8->fields_;
  pUVar8->fields_ = pUVar9->fields_;
  pUVar9->fields_ = pvVar6;
LAB_003f0502:
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void BlobProto::InternalSwap(BlobProto* other) {
  data_.InternalSwap(&other->data_);
  diff_.InternalSwap(&other->diff_);
  double_data_.InternalSwap(&other->double_data_);
  double_diff_.InternalSwap(&other->double_diff_);
  std::swap(shape_, other->shape_);
  std::swap(num_, other->num_);
  std::swap(channels_, other->channels_);
  std::swap(height_, other->height_);
  std::swap(width_, other->width_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}